

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::BeamData::BeamData(BeamData *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__BeamData_00312040;
  this->m_f32AziCtr = 0.0;
  this->m_f32AziSwp = 0.0;
  this->m_f32EleCtr = 0.0;
  this->m_f32EleSwp = 0.0;
  this->m_f32SwpSyn = 0.0;
  return;
}

Assistant:

BeamData::BeamData() :
    m_f32AziCtr( 0 ),
    m_f32AziSwp( 0 ),
    m_f32EleCtr( 0 ),
    m_f32EleSwp( 0 ),
    m_f32SwpSyn( 0 )
{
}